

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O0

double __thiscall dbscan::DBSCAN::euclideanDist(DBSCAN *this,_3DPoint *pa,_3DPoint *pb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  _3DPoint *pb_local;
  _3DPoint *pa_local;
  DBSCAN *this_local;
  
  dVar1 = pow(pa->m_x - pb->m_x,2.0);
  dVar2 = pow(pa->m_y - pb->m_y,2.0);
  dVar3 = pow(pa->m_z - pb->m_z,2.0);
  dVar1 = sqrt(dVar1 + dVar2 + dVar3);
  return dVar1;
}

Assistant:

double DBSCAN::euclideanDist(_3DPoint* pa, _3DPoint* pb) {
    return sqrt(
        pow((pa->m_x - pb->m_x), 2) +
        pow((pa->m_y - pb->m_y), 2) +
        pow((pa->m_z - pb->m_z), 2)
    );
}